

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O0

int __thiscall re2::PCRE::NumberOfCapturingGroups(PCRE *this)

{
  int iVar1;
  ostream *poVar2;
  LogMessage local_1a0;
  int local_1c;
  PCRE *pPStack_18;
  int result;
  PCRE *this_local;
  
  if (this->re_partial_ == (pcre *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    pPStack_18 = this;
    iVar1 = pcre_fullinfo(this->re_partial_,(pcre_extra *)0x0,0,&local_1c);
    if (iVar1 != 0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc",
                 0x2d6);
      poVar2 = LogMessage::stream(&local_1a0);
      std::operator<<(poVar2,
                      "Check failed: pcre_fullinfo(re_partial_, NULL, PCRE_INFO_CAPTURECOUNT, &result) == 0"
                     );
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
    }
    this_local._4_4_ = local_1c;
  }
  return this_local._4_4_;
}

Assistant:

int PCRE::NumberOfCapturingGroups() const {
  if (re_partial_ == NULL) return -1;

  int result;
  CHECK(pcre_fullinfo(re_partial_,       // The regular expression object
                      NULL,              // We did not study the pattern
                      PCRE_INFO_CAPTURECOUNT,
                      &result) == 0);
  return result;
}